

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void rnn_parsefile(rnndb *db,char *file_orig)

{
  int iVar1;
  char *file_00;
  void *pvVar2;
  rnndb *db_00;
  long in_RDI;
  xmlNode *chain;
  xmlNode *root;
  xmlDocPtr doc;
  char *file;
  int i;
  _xmlNode *node;
  _xmlNode *file_01;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  
  file_00 = (char *)malloc(0x200);
  resolve_using_path((char *)doc,(char *)root,chain._4_4_);
  iVar3 = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x78) <= iVar3) {
      if (*(int *)(in_RDI + 0x7c) <= *(int *)(in_RDI + 0x78)) {
        if (*(int *)(in_RDI + 0x7c) == 0) {
          *(undefined4 *)(in_RDI + 0x7c) = 0x10;
        }
        else {
          *(int *)(in_RDI + 0x7c) = *(int *)(in_RDI + 0x7c) << 1;
        }
        pvVar2 = realloc(*(void **)(in_RDI + 0x70),(long)*(int *)(in_RDI + 0x7c) << 3);
        *(void **)(in_RDI + 0x70) = pvVar2;
      }
      iVar1 = *(int *)(in_RDI + 0x78);
      *(int *)(in_RDI + 0x78) = iVar1 + 1;
      *(char **)(*(long *)(in_RDI + 0x70) + (long)iVar1 * 8) = file_00;
      db_00 = (rnndb *)xmlParseFile(file_00);
      if (db_00 == (rnndb *)0x0) {
        fprintf(_stderr,"%s: couldn\'t open database file. Please set the env var RNN_PATH.\n",
                file_00);
        *(undefined4 *)(in_RDI + 0x80) = 1;
      }
      else {
        for (file_01 = *(_xmlNode **)&(db_00->copyright).authorsnum; file_01 != (_xmlNode *)0x0;
            file_01 = file_01->next) {
          if (file_01->type == XML_ELEMENT_NODE) {
            iVar1 = strcmp((char *)file_01->name,"database");
            if (iVar1 == 0) {
              for (node = file_01->children; node != (_xmlNode *)0x0; node = node->next) {
                if (((node->type == XML_ELEMENT_NODE) &&
                    (iVar1 = trytop((rnndb *)CONCAT44(iVar3,in_stack_ffffffffffffffe8),file_00,
                                    (xmlNode *)db_00), iVar1 == 0)) &&
                   (iVar1 = trydoc(db_00,(char *)file_01,node), iVar1 == 0)) {
                  fprintf(_stderr,"%s:%d: wrong tag in database: <%s>\n",file_00,(ulong)node->line,
                          node->name);
                  *(undefined4 *)(in_RDI + 0x80) = 1;
                }
              }
            }
            else {
              fprintf(_stderr,"%s:%d: wrong top-level tag <%s>\n",file_00,(ulong)file_01->line,
                      file_01->name);
              *(undefined4 *)(in_RDI + 0x80) = 1;
            }
          }
        }
        xmlFreeDoc(db_00);
      }
      return;
    }
    iVar1 = strcmp(*(char **)(*(long *)(in_RDI + 0x70) + (long)iVar3 * 8),file_00);
    if (iVar1 == 0) break;
    iVar3 = iVar3 + 1;
  }
  return;
}

Assistant:

void rnn_parsefile (struct rnndb *db, char *file_orig) {
	int i;
	char *file = (char *) malloc(512);

	resolve_using_path(file_orig, file, 512);

	for (i = 0; i < db->filesnum; i++)
		if (!strcmp(db->files[i], file))
			return;
		
	ADDARRAY(db->files, file);
	xmlDocPtr doc = xmlParseFile(file);
	if (!doc) {
		fprintf (stderr, "%s: couldn't open database file. Please set the env var RNN_PATH.\n", file);
		db->estatus = 1;
		return;
	}
	xmlNode *root = doc->children;
	while (root) {
		if (root->type != XML_ELEMENT_NODE) {
		} else if (strcmp(root->name, "database")) {
			fprintf (stderr, "%s:%d: wrong top-level tag <%s>\n", file, root->line, root->name);
			db->estatus = 1;
		} else {
			xmlNode *chain = root->children;
			while (chain) {
				if (chain->type != XML_ELEMENT_NODE) {
				} else if (!trytop(db, file, chain) && !trydoc(db, file, chain)) {
					fprintf (stderr, "%s:%d: wrong tag in database: <%s>\n", file, chain->line, chain->name);
					db->estatus = 1;
				}
				chain = chain->next;
			}
		}
		root = root->next;
	}
	xmlFreeDoc(doc);
}